

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall CapabilitiesToStateMask::setAlphaFillRectMask(CapabilitiesToStateMask *this)

{
  long in_RDI;
  
  updateStateBits((uint *)(in_RDI + 0x10),1,false);
  updateStateBits((uint *)(in_RDI + 0x10),2,false);
  updateStateBits((uint *)(in_RDI + 0x10),0x10,false);
  updateStateBits((uint *)(in_RDI + 0x10),0x20,true);
  updateStateBits((uint *)(in_RDI + 0x10),0x100,true);
  updateStateBits((uint *)(in_RDI + 0x10),0x1000,true);
  updateStateBits((uint *)(in_RDI + 0x10),0x2000,false);
  updateStateBits((uint *)(in_RDI + 0x10),0x4000,false);
  updateStateBits((uint *)(in_RDI + 0x10),0x10000,false);
  updateStateBits((uint *)(in_RDI + 0x10),0x20000,false);
  return;
}

Assistant:

void setAlphaFillRectMask() {
        updateStateBits(&alphaFillRectMask, STATE_XFORM_SCALE, false);
        updateStateBits(&alphaFillRectMask, STATE_XFORM_COMPLEX, false);

        updateStateBits(&alphaFillRectMask, STATE_BRUSH_PATTERN, false);
        updateStateBits(&alphaFillRectMask, STATE_BRUSH_ALPHA, true);

        updateStateBits(&alphaFillRectMask, STATE_PEN_ENABLED, true);

        //Sub-pixel aliasing should not be sent to the blitter
        updateStateBits(&alphaFillRectMask, STATE_ANTIALIASING, true);
        updateStateBits(&alphaFillRectMask, STATE_ALPHA, false);
        updateStateBits(&alphaFillRectMask, STATE_BLENDING_COMPLEX, false);

        updateStateBits(&alphaFillRectMask, STATE_CLIPSYS_COMPLEX, false);
        updateStateBits(&alphaFillRectMask, STATE_CLIP_COMPLEX, false);
    }